

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_creader_set_fread(Curl_easy *data,curl_off_t len)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  Curl_creader *in_RAX;
  Curl_creader *r;
  
  r = in_RAX;
  CVar2 = Curl_creader_create(&r,data,&cr_in,CURL_CR_CLIENT);
  if (CVar2 == CURLE_OK) {
    *(curl_off_t *)((long)r->ctx + 0x30) = len;
    cl_reset_reader(data);
    CVar2 = do_init_reader_stack(data,r);
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(data,"add fread reader, len=%ld -> %d",len,(ulong)CVar2);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_creader_set_fread(struct Curl_easy *data, curl_off_t len)
{
  CURLcode result;
  struct Curl_creader *r;
  struct cr_in_ctx *ctx;

  result = Curl_creader_create(&r, data, &cr_in, CURL_CR_CLIENT);
  if(result)
    goto out;
  ctx = r->ctx;
  ctx->total_len = len;

  cl_reset_reader(data);
  result = do_init_reader_stack(data, r);
out:
  CURL_TRC_READ(data, "add fread reader, len=%"FMT_OFF_T " -> %d",
                len, result);
  return result;
}